

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.h
# Opt level: O3

bool Js::JavascriptNumber::TryGetInt32Value<false>(double value,int32 *int32Value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (int32Value == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0x46,"(int32Value)","int32Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) &&
     (bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000), !bVar2)) {
    *int32Value = (int)value;
    return true;
  }
  return false;
}

Assistant:

static bool TryGetInt32Value(const double value, int32 *const int32Value)
        {
            Assert(int32Value);

            const int32 i = static_cast<int32>(value);
            if (static_cast<double>(i) != value || (!acceptNegZero && IsNegZero(value)))
            {
                return false;
            }

            *int32Value = i;
            return true;
        }